

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall t_dart_generator::generate_dart_pubspec(t_dart_generator *this)

{
  int *piVar1;
  pointer pcVar2;
  t_program *ptVar3;
  pointer pptVar4;
  undefined8 uVar5;
  ostream *poVar6;
  _Alloc_hider _Var7;
  pointer pptVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string f_pubspec_name;
  ofstream_with_content_based_conditional_update f_pubspec;
  allocator local_211;
  undefined1 local_210 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  char local_1e0 [16];
  undefined1 local_1d0 [144];
  undefined1 local_140;
  ios_base local_138 [264];
  
  local_1f0._M_allocated_capacity = (size_type)local_1e0;
  pcVar2 = (this->base_dir_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar2,pcVar2 + (this->base_dir_)._M_string_length);
  std::__cxx11::string::append(local_1f0._M_local_buf);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string
            ((string *)local_210,(char *)local_1f0._M_allocated_capacity,&local_211);
  std::__cxx11::string::_M_assign((string *)(local_1d0 + 0x70));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
    operator_delete((void *)local_210._0_8_);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"name: ",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->library_name_)._M_dataplus._M_p,
                      (this->library_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"version: 0.0.1",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"description: Autogenerated by Thrift Compiler",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"environment:",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"sdk: \'>=1.24.3 <3.0.0\'",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"dependencies:",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if ((this->pubspec_lib_)._M_string_length == 0) {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"thrift:  # ^",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,dart_thrift_version_abi_cxx11_._M_dataplus._M_p,
                        dart_thrift_version_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"path: ../../../../lib/dart",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  else {
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_210,this,&this->pubspec_lib_,'|');
    uVar5 = local_210._8_8_;
    if (local_210._0_8_ != local_210._8_8_) {
      pbVar9 = (pointer)local_210._0_8_;
      do {
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != (pointer)uVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_210);
  }
  ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
  pptVar8 = (ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pptVar4 = (ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pptVar8 != pptVar4) {
    do {
      find_library_name_abi_cxx11_((string *)local_210,this,*pptVar8);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_210._0_8_,local_210._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"path: ../",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_210._0_8_,local_210._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      if ((pointer)local_210._0_8_ != (pointer)(local_210 + 0x10)) {
        operator_delete((void *)local_210._0_8_);
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 != pptVar4);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  _Var7 = ::endl_abi_cxx11_._M_dataplus;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(int)_Var7._M_p);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if ((char *)local_1f0._M_allocated_capacity != local_1e0) {
    operator_delete((void *)local_1f0._M_allocated_capacity);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_pubspec() {
  string f_pubspec_name = base_dir_ + "/pubspec.yaml";
  ofstream_with_content_based_conditional_update f_pubspec;
  f_pubspec.open(f_pubspec_name.c_str());

  indent(f_pubspec) << "name: " << library_name_ << endl;
  indent(f_pubspec) << "version: 0.0.1" << endl;
  indent(f_pubspec) << "description: Autogenerated by Thrift Compiler" << endl;
  f_pubspec << endl;

  indent(f_pubspec) << "environment:" << endl;
  indent_up();
  indent(f_pubspec) << "sdk: '>=1.24.3 <3.0.0'" << endl;
  indent_down();
  f_pubspec << endl;

  indent(f_pubspec) << "dependencies:" << endl;
  indent_up();

  if (pubspec_lib_.empty()) {
    // default to relative path within working directory, which works for tests
    indent(f_pubspec) << "thrift:  # ^" << dart_thrift_version << endl;
    indent_up();
    indent(f_pubspec) << "path: ../../../../lib/dart" << endl;
    indent_down();
  } else {
    const vector<std::string> lines = split(pubspec_lib_, '|');
    for (const auto & line : lines) {
      indent(f_pubspec) << line << endl;
    }
  }

  // add included thrift files as dependencies
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    string include_name = find_library_name(include);
    indent(f_pubspec) << include_name << ":" << endl;
    indent_up();
    indent(f_pubspec) << "path: ../" << include_name << endl;
    indent_down();
  }

  indent_down();
  f_pubspec << endl;

  f_pubspec.close();
}